

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

bool __thiscall CConnman::AttemptToEvictConnection(CConnman *this)

{
  long lVar1;
  pointer ppCVar2;
  CNode *pCVar3;
  bool bVar4;
  Network NVar5;
  Logger *this_00;
  long lVar6;
  pointer ppCVar7;
  NodeEvictionCandidate *pNVar8;
  pointer pNVar9;
  long in_FS_OFFSET;
  bool bVar10;
  byte bVar11;
  string_view source_file;
  optional<long> oVar12;
  string_view logging_function;
  NodeId local_b0;
  vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> vEvictionCandidates;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock59;
  NodeEvictionCandidate candidate;
  
  bVar11 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  vEvictionCandidates.
  super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vEvictionCandidates.
  super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vEvictionCandidates.
  super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  criticalblock59.super_unique_lock._M_owns = false;
  criticalblock59.super_unique_lock._M_device = &(this->m_nodes_mutex).super_recursive_mutex;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock59.super_unique_lock);
  ppCVar7 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar2 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar7 != ppCVar2) {
    do {
      pCVar3 = *ppCVar7;
      if (((pCVar3->fDisconnect)._M_base._M_i & 1U) == 0) {
        candidate.id = pCVar3->id;
        candidate.m_connected.__r = (pCVar3->m_connected).__r;
        candidate.m_min_ping_time.__r = (pCVar3->m_min_ping_time)._M_i.__r;
        candidate.m_last_block_time.__r = (pCVar3->m_last_block_time)._M_i.__r;
        candidate.m_last_tx_time.__r = (pCVar3->m_last_tx_time)._M_i.__r;
        candidate.fRelevantServices = (bool)((pCVar3->m_has_all_wanted_services)._M_base._M_i & 1);
        candidate.m_relay_txs = (bool)((pCVar3->m_relays_txs)._M_base._M_i & 1);
        candidate.fBloomFilter = (bool)((pCVar3->m_bloom_filter_loaded)._M_base._M_i & 1);
        candidate.nKeyedNetGroup = pCVar3->nKeyedNetGroup;
        candidate.prefer_evict = pCVar3->m_prefer_evict;
        candidate.m_is_local = CNetAddr::IsLocal((CNetAddr *)&pCVar3->addr);
        NVar5 = NET_ONION;
        if (pCVar3->m_inbound_onion == false) {
          NVar5 = CNetAddr::GetNetClass((CNetAddr *)&pCVar3->addr);
        }
        candidate.m_network = NVar5;
        candidate.m_noban = (~pCVar3->m_permission_flags & 0x50) == 0;
        candidate.m_conn_type = pCVar3->m_conn_type;
        if (vEvictionCandidates.
            super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            vEvictionCandidates.
            super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>::
          _M_realloc_insert<NodeEvictionCandidate_const&>
                    ((vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>> *)
                     &vEvictionCandidates,
                     (iterator)
                     vEvictionCandidates.
                     super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&candidate);
        }
        else {
          pNVar8 = &candidate;
          pNVar9 = vEvictionCandidates.
                   super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
            pNVar9->id = pNVar8->id;
            pNVar8 = (NodeEvictionCandidate *)((long)pNVar8 + (ulong)bVar11 * -0x10 + 8);
            pNVar9 = (pointer)((long)pNVar9 + (ulong)bVar11 * -0x10 + 8);
          }
          vEvictionCandidates.
          super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>._M_impl.
          super__Vector_impl_data._M_finish =
               vEvictionCandidates.
               super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      ppCVar7 = ppCVar7 + 1;
    } while (ppCVar7 != ppCVar2);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock59.super_unique_lock);
  oVar12 = SelectNodeToEvict(&vEvictionCandidates);
  if (((undefined1  [16])
       oVar12.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long> &
      (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    bVar10 = false;
  }
  else {
    criticalblock59.super_unique_lock._M_owns = false;
    criticalblock59.super_unique_lock._M_device = &(this->m_nodes_mutex).super_recursive_mutex;
    std::unique_lock<std::recursive_mutex>::lock(&criticalblock59.super_unique_lock);
    ppCVar7 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppCVar2 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    bVar10 = ppCVar7 != ppCVar2;
    if (bVar10) {
      pCVar3 = *ppCVar7;
      lVar6 = pCVar3->id;
      while (lVar6 != oVar12.super__Optional_base<long,_true,_true>._M_payload.
                      super__Optional_payload_base<long>._M_payload) {
        ppCVar7 = ppCVar7 + 1;
        bVar10 = ppCVar7 != ppCVar2;
        if (ppCVar7 == ppCVar2) goto LAB_008cdba7;
        pCVar3 = *ppCVar7;
        lVar6 = pCVar3->id;
      }
      this_00 = LogInstance();
      bVar4 = BCLog::Logger::WillLogCategoryLevel(this_00,NET,Debug);
      if (bVar4) {
        ConnectionTypeAsString_abi_cxx11_((string *)&candidate,pCVar3->m_conn_type);
        local_b0 = pCVar3->id;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
        ;
        source_file._M_len = 0x57;
        logging_function._M_str = "AttemptToEvictConnection";
        logging_function._M_len = 0x18;
        LogPrintFormatInternal<std::__cxx11::string,long>
                  (logging_function,source_file,0x69d,NET,Debug,(ConstevalFormatString<2U>)0xf9b8a9,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&candidate,
                   &local_b0);
        if ((microseconds *)candidate.id != &candidate.m_min_ping_time) {
          operator_delete((void *)candidate.id,candidate.m_min_ping_time.__r + 1);
        }
      }
      LOCK();
      (pCVar3->fDisconnect)._M_base._M_i = true;
      UNLOCK();
    }
LAB_008cdba7:
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock59.super_unique_lock);
  }
  if (vEvictionCandidates.
      super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vEvictionCandidates.
                    super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vEvictionCandidates.
                          super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vEvictionCandidates.
                          super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar10;
  }
  __stack_chk_fail();
}

Assistant:

bool CConnman::AttemptToEvictConnection()
{
    std::vector<NodeEvictionCandidate> vEvictionCandidates;
    {

        LOCK(m_nodes_mutex);
        for (const CNode* node : m_nodes) {
            if (node->fDisconnect)
                continue;
            NodeEvictionCandidate candidate{
                .id = node->GetId(),
                .m_connected = node->m_connected,
                .m_min_ping_time = node->m_min_ping_time,
                .m_last_block_time = node->m_last_block_time,
                .m_last_tx_time = node->m_last_tx_time,
                .fRelevantServices = node->m_has_all_wanted_services,
                .m_relay_txs = node->m_relays_txs.load(),
                .fBloomFilter = node->m_bloom_filter_loaded.load(),
                .nKeyedNetGroup = node->nKeyedNetGroup,
                .prefer_evict = node->m_prefer_evict,
                .m_is_local = node->addr.IsLocal(),
                .m_network = node->ConnectedThroughNetwork(),
                .m_noban = node->HasPermission(NetPermissionFlags::NoBan),
                .m_conn_type = node->m_conn_type,
            };
            vEvictionCandidates.push_back(candidate);
        }
    }
    const std::optional<NodeId> node_id_to_evict = SelectNodeToEvict(std::move(vEvictionCandidates));
    if (!node_id_to_evict) {
        return false;
    }
    LOCK(m_nodes_mutex);
    for (CNode* pnode : m_nodes) {
        if (pnode->GetId() == *node_id_to_evict) {
            LogDebug(BCLog::NET, "selected %s connection for eviction peer=%d; disconnecting\n", pnode->ConnectionTypeAsString(), pnode->GetId());
            pnode->fDisconnect = true;
            return true;
        }
    }
    return false;
}